

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

void __thiscall
capnp::DynamicStruct::Builder::set
          (Builder *this,StringPtr name,initializer_list<capnp::DynamicValue::Reader> value)

{
  undefined8 uVar1;
  iterator pRVar2;
  long lVar3;
  uint index;
  undefined8 *puVar4;
  Reader *pRVar5;
  long lVar6;
  byte bVar7;
  Reader element;
  BuilderFor<capnp::DynamicList> list;
  Reader local_f0;
  Builder local_a8;
  BuilderFor<DynamicList> local_68;
  
  pRVar2 = value._M_array;
  bVar7 = 0;
  StructSchema::getFieldByName((Field *)&local_f0,&this->schema,name);
  init((Builder *)&local_a8,(EVP_PKEY_CTX *)this);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_68,&local_a8);
  uVar1 = local_a8.field_1.textValue.content.ptr;
  if ((local_a8.type == CAPABILITY) && (local_a8.field_1._8_8_ != (SegmentBuilder *)0x0)) {
    local_a8.field_1.textValue.content.ptr = (char *)0x0;
    (*(code *)(((local_a8.field_1.anyPointerValue.builder.segment)->super_SegmentReader).arena)->
              _vptr_Arena)
              (local_a8.field_1.intValue,
               (char *)(uVar1 + (long)(((SegmentBuilder *)uVar1)->super_SegmentReader).arena[-2].
                                      _vptr_Arena));
  }
  if (value._M_len != 0) {
    lVar6 = 0;
    index = 0;
    do {
      if (*(int *)((long)&pRVar2->type + lVar6) == 0xb) {
        local_f0.type = CAPABILITY;
        (**(code **)(**(long **)((long)&pRVar2->field_1 + lVar6 + 8) + 0x20))(&local_f0.field_1);
        local_f0.field_1.listValue.reader.segment =
             (SegmentReader *)*(undefined8 *)((long)&pRVar2->field_1 + lVar6 + 0x10);
      }
      else {
        puVar4 = (undefined8 *)((long)&pRVar2->type + lVar6);
        pRVar5 = &local_f0;
        for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
          *(undefined8 *)pRVar5 = *puVar4;
          puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
          pRVar5 = (Reader *)((long)pRVar5 + (ulong)bVar7 * -0x10 + 8);
        }
      }
      DynamicList::Builder::set(&local_68,index,&local_f0);
      uVar1 = local_f0.field_1.textValue.super_StringPtr.content.size_;
      if ((local_f0.type == CAPABILITY) && (local_f0.field_1._8_8_ != (SegmentReader *)0x0)) {
        local_f0.field_1.textValue.super_StringPtr.content.size_ = 0;
        (*(code *)(local_f0.field_1.anyPointerValue.reader.segment)->arena->_vptr_Arena)
                  (local_f0.field_1.intValue,
                   (long)&((SegmentReader *)uVar1)->arena +
                   (long)((SegmentReader *)uVar1)->arena[-2]._vptr_Arena);
      }
      lVar6 = lVar6 + 0x48;
      index = index + 1;
    } while (value._M_len * 0x48 != lVar6);
  }
  return;
}

Assistant:

void DynamicStruct::Builder::set(kj::StringPtr name,
                                 std::initializer_list<DynamicValue::Reader> value) {
  auto list = init(name, value.size()).as<DynamicList>();
  uint i = 0;
  for (auto element: value) {
    list.set(i++, element);
  }
}